

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::RollupOutput::PrettyPrintTree
          (RollupOutput *this,RollupRow *row,size_t indent,OutputOptions *options,ostream *out)

{
  pointer b;
  RollupRow *pRVar1;
  bool bVar2;
  RollupRow *child;
  RollupRow *row_00;
  
  PrettyPrintRow(this,row,indent,options,out);
  if ((row->size).file != 0 || (row->size).vm != 0) {
    b = (row->sorted_children).
        super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
        super__Vector_impl_data._M_start;
    if ((((long)(row->sorted_children).
                super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)b == 0x88) &&
        (*(pointer *)
          ((long)&(b->sorted_children).
                  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> + 8) ==
         *(pointer *)
          &(b->sorted_children).
           super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl)) &&
       (bVar2 = IsSame(&row->name,&b->name), bVar2)) {
      return;
    }
    row_00 = (row->sorted_children).
             super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar1 = (row->sorted_children).
             super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (row_00 != pRVar1) {
      do {
        PrettyPrintTree(this,row_00,indent + 2,options,out);
        row_00 = row_00 + 1;
      } while (row_00 != pRVar1);
    }
  }
  return;
}

Assistant:

void RollupOutput::PrettyPrintTree(const RollupRow& row, size_t indent,
                                   const OutputOptions& options,
                                   std::ostream* out) const {
  // Rows are printed before their sub-rows.
  PrettyPrintRow(row, indent, options, out);

  if (!row.size.vm && !row.size.file) {
    return;
  }

  if (row.sorted_children.size() == 1 &&
      row.sorted_children[0].sorted_children.size() == 0 &&
      IsSame(row.name, row.sorted_children[0].name)) {
    return;
  }

  for (const auto& child : row.sorted_children) {
    PrettyPrintTree(child, indent + 2, options, out);
  }
}